

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.hpp
# Opt level: O1

void __thiscall
Args::Command::Command<char_const(&)[4]>
          (Command *this,char (*nm) [4],ValueOptions opt,bool isSubCommandRequired)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  pointer pcVar3;
  bool bVar4;
  long lVar5;
  long lVar6;
  long *plVar7;
  logic_error *plVar8;
  char *pcVar9;
  ulong *puVar10;
  ulong *local_100;
  undefined8 local_f0;
  undefined8 uStack_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  uint *local_c0;
  undefined8 local_b8;
  uint local_b0;
  undefined4 uStack_ac;
  undefined4 uStack_a8;
  undefined4 uStack_a4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_a0;
  String *local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  long *local_70 [2];
  long local_60 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  GroupIface::GroupIface<char_const(&)[4]>(&this->super_GroupIface,nm,false);
  (this->super_GroupIface).super_ArgIface._vptr_ArgIface = (_func_int **)&PTR__Command_00172630;
  *(ValueOptions *)&(this->super_GroupIface).field_0x4c = opt;
  local_98 = &this->m_valueSpecifier;
  local_a0 = &(this->m_valueSpecifier).field_2;
  (this->m_valueSpecifier)._M_dataplus._M_p = (pointer)local_a0;
  (this->m_valueSpecifier)._M_string_length = 0;
  (this->m_valueSpecifier).field_2._M_local_buf[0] = '\0';
  (this->m_description)._M_dataplus._M_p = (pointer)&(this->m_description).field_2;
  (this->m_description)._M_string_length = 0;
  (this->m_description).field_2._M_local_buf[0] = '\0';
  (this->m_longDescription)._M_dataplus._M_p = (pointer)&(this->m_longDescription).field_2;
  (this->m_longDescription)._M_string_length = 0;
  (this->m_longDescription).field_2._M_local_buf[0] = '\0';
  this->m_isDefined = false;
  this->m_isSubCommandRequired = isSubCommandRequired;
  (this->m_values).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_values).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_values).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_defaultValues).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_defaultValues).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_defaultValues).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_subCommand = (Command *)0x0;
  paVar1 = &local_e0.field_2;
  pcVar3 = (this->super_GroupIface).m_name._M_dataplus._M_p;
  local_e0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_e0,pcVar3,pcVar3 + (this->super_GroupIface).m_name._M_string_length);
  lVar5 = std::__cxx11::string::find((char *)&local_e0,0x158ffe,0);
  bVar4 = true;
  if (lVar5 != 0) {
    (*(this->super_GroupIface).super_ArgIface._vptr_ArgIface[3])(local_70,this);
    lVar6 = std::__cxx11::string::find((char *)local_70,0x158ffe,0);
    if ((lVar6 == 0) || (lVar6 = std::__cxx11::string::find((char)local_70,0x2d), lVar6 != 0)) {
      bVar4 = false;
    }
  }
  if ((lVar5 != 0) && (local_70[0] != local_60)) {
    operator_delete(local_70[0],local_60[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  if (!bVar4) {
    (*(this->super_GroupIface).super_ArgIface._vptr_ArgIface[3])(&local_e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != paVar1) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
    }
    if (local_e0._M_string_length != 0) {
      iVar2 = *(int *)&(this->super_GroupIface).field_0x4c;
      if (iVar2 == 1) {
        pcVar9 = "arg";
      }
      else {
        if (iVar2 != 2) {
          return;
        }
        pcVar9 = "args";
      }
      std::__cxx11::string::_M_replace
                ((ulong)local_98,0,(char *)(this->m_valueSpecifier)._M_string_length,(ulong)pcVar9);
      return;
    }
    plVar8 = (logic_error *)__cxa_allocate_exception(0x30);
    local_c0 = &local_b0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_c0,"Command can\'t be with empty name.","");
    std::logic_error::logic_error(plVar8,"Please use desc() method of the exception.");
    *(undefined ***)plVar8 = &PTR__BaseException_001725a0;
    *(logic_error **)(plVar8 + 0x10) = plVar8 + 0x20;
    if (local_c0 == &local_b0) {
      *(uint *)(plVar8 + 0x20) = local_b0;
      *(undefined4 *)(plVar8 + 0x24) = uStack_ac;
      *(undefined4 *)(plVar8 + 0x28) = uStack_a8;
      *(undefined4 *)(plVar8 + 0x2c) = uStack_a4;
    }
    else {
      *(uint **)(plVar8 + 0x10) = local_c0;
      *(ulong *)(plVar8 + 0x20) = CONCAT44(uStack_ac,local_b0);
    }
    *(undefined8 *)(plVar8 + 0x18) = local_b8;
    local_c0 = &local_b0;
    local_b8 = 0;
    local_b0 = local_b0 & 0xffffff00;
    __cxa_throw(plVar8,&BaseException::typeinfo,BaseException::~BaseException);
  }
  plVar8 = (logic_error *)__cxa_allocate_exception(0x30);
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_90,
             "Command\'s name can\'t start with \"-\" whereas you are trying to set name to \"","");
  (*(this->super_GroupIface).super_ArgIface._vptr_ArgIface[3])(&local_50,this);
  std::operator+(&local_e0,&local_90,&local_50);
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_e0);
  local_100 = (ulong *)*plVar7;
  puVar10 = (ulong *)(plVar7 + 2);
  if (local_100 == puVar10) {
    local_f0 = *puVar10;
    uStack_e8 = plVar7[3];
    local_100 = &local_f0;
  }
  else {
    local_f0 = *puVar10;
  }
  lVar5 = plVar7[1];
  *plVar7 = (long)puVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  std::logic_error::logic_error(plVar8,"Please use desc() method of the exception.");
  *(undefined ***)plVar8 = &PTR__BaseException_001725a0;
  *(logic_error **)(plVar8 + 0x10) = plVar8 + 0x20;
  if (local_100 == &local_f0) {
    *(undefined4 *)(plVar8 + 0x20) = (undefined4)local_f0;
    *(undefined4 *)(plVar8 + 0x24) = local_f0._4_4_;
    *(undefined4 *)(plVar8 + 0x28) = (undefined4)uStack_e8;
    *(undefined4 *)(plVar8 + 0x2c) = uStack_e8._4_4_;
  }
  else {
    *(ulong **)(plVar8 + 0x10) = local_100;
    *(ulong *)(plVar8 + 0x20) = local_f0;
  }
  *(long *)(plVar8 + 0x18) = lVar5;
  local_f0 = local_f0 & 0xffffffffffffff00;
  __cxa_throw(plVar8,&BaseException::typeinfo,BaseException::~BaseException);
}

Assistant:

explicit Command( T && nm,
		ValueOptions opt = ValueOptions::NoValue,
		bool isSubCommandRequired = false )
		:	GroupIface( std::forward< T > ( nm ) )
		,	m_opt( opt )
		,	m_isDefined( false )
		,	m_isSubCommandRequired( isSubCommandRequired )
		,	m_subCommand( nullptr )
	{
		if( details::isArgument( name() ) || details::isFlag( name() ) )
			throw BaseException( String( SL( "Command's name can't "
				"start with \"-\" whereas you are trying to set name to \"" ) ) +
				name() + SL( "\"." ) );

		if( name().empty() )
			throw BaseException(
				String( SL( "Command can't be with empty name." ) ) );

		switch( m_opt )
		{
			case ValueOptions::OneValue :
			{
				m_valueSpecifier = SL( "arg" );
			}
				break;

			case ValueOptions::ManyValues :
			{
				m_valueSpecifier = SL( "args" );
			}
				break;

			default :
				break;
		}
	}